

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

string * __thiscall
pbrt::ShapeIntersection::ToString_abi_cxx11_(string *__return_storage_ptr__,ShapeIntersection *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<pbrt::SurfaceInteraction_const&,float_const&>
            (__return_storage_ptr__,"[ ShapeIntersection intr: %s tHit: %f ]",&this->intr,
             &this->tHit);
  return __return_storage_ptr__;
}

Assistant:

std::string ShapeIntersection::ToString() const {
    return StringPrintf("[ ShapeIntersection intr: %s tHit: %f ]", intr, tHit);
}